

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall
Fl_Menu_Item::pulldown
          (Fl_Menu_Item *this,int X,int Y,int W,int H,Fl_Menu_Item *initial_item,Fl_Menu_ *pbutton,
          Fl_Menu_Item *t,int menubar)

{
  Fl_Menu_Item *pFVar1;
  Fl_Menu_Item *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Window *pFVar7;
  menuwindow *pmVar8;
  menuwindow *pmVar9;
  bool bVar10;
  int local_394;
  Fl_Menu_Item *m;
  int ny;
  int nx;
  menuwindow *tt;
  int local_288;
  int menu;
  int waH;
  int waW;
  int waY;
  int waX;
  int dx;
  int dy;
  menuwindow *n;
  int nY;
  int nX;
  Fl_Menu_Item *menutable;
  Fl_Menu_Item *title;
  Fl_Menu_Item *m_1;
  menuwindow *cw;
  Fl_Menu_Item *oldi;
  int k;
  menustate pp;
  undefined1 local_158 [8];
  menuwindow mw;
  Fl_Window *w;
  Fl_Menu_Item *initial_item_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Menu_Item *this_local;
  
  Fl_Group::current((Fl_Group *)0x0);
  button = pbutton;
  if ((pbutton == (Fl_Menu_ *)0x0) ||
     (pFVar7 = Fl_Widget::window(&pbutton->super_Fl_Widget), pFVar7 == (Fl_Window *)0x0)) {
    iVar3 = Fl::event_x_root();
    iVar4 = Fl::event_x();
    W_local = (iVar3 - iVar4) + X;
    iVar3 = Fl::event_y_root();
    iVar4 = Fl::event_y();
    H_local = (iVar3 - iVar4) + Y;
  }
  else {
    mw.menu = (Fl_Menu_Item *)Fl_Widget::window(&pbutton->super_Fl_Widget);
    H_local = Y;
    W_local = X;
    for (; mw.menu != (Fl_Menu_Item *)0x0;
        mw.menu = (Fl_Menu_Item *)Fl_Widget::window((Fl_Widget *)mw.menu)) {
      iVar3 = Fl_Widget::x((Fl_Widget *)mw.menu);
      W_local = iVar3 + W_local;
      iVar3 = Fl_Widget::y((Fl_Widget *)mw.menu);
      H_local = iVar3 + H_local;
    }
  }
  pmVar9 = (menuwindow *)local_158;
  menuwindow::menuwindow(pmVar9,this,W_local,H_local,W,H,initial_item,t,menubar,0,0);
  Fl::grab((Fl_Window *)pmVar9);
  ::p = (menustate *)&k;
  pp._8_8_ = local_158;
  pp.p[0x13]._0_4_ = 1;
  pp.p[0x13]._4_4_ = menubar;
  pp.nummenus = 0;
  pp.state = 0;
  pp._188_4_ = 0;
  if ((initial_item == (Fl_Menu_Item *)0x0) || (mw.itemheight < 0)) {
    _k = (menuwindow *)0x0;
    pp.current_item._0_4_ = 0;
    pp.current_item._4_4_ = -1;
    if (menubar != 0) {
      pmVar9 = (menuwindow *)local_158;
      iVar3 = menuwindow::handle(pmVar9,5);
      if (iVar3 == 0) {
        Fl::grab((Fl_Window *)0x0);
        this_local = (Fl_Menu_Item *)0x0;
LAB_002005c9:
        oldi._4_4_ = 1;
        menuwindow::~menuwindow((menuwindow *)local_158);
        return this_local;
      }
    }
    w = (Fl_Window *)_k;
    if (_k == (menuwindow *)0x0) goto LAB_001ffa81;
  }
  else {
    setitem(0,mw.itemheight);
    w = (Fl_Window *)initial_item;
  }
  do {
    while( true ) {
      m_1 = (Fl_Menu_Item *)pp.p[(long)(int)pp.current_item + -1];
      title = (Fl_Menu_Item *)_k;
      iVar3 = activevisible((Fl_Menu_Item *)_k);
      if (iVar3 != 0) break;
      pmVar9 = (menuwindow *)m_1;
      menuwindow::set_selected((menuwindow *)m_1,-1);
LAB_001ffa81:
      while( true ) {
        do {
          for (oldi._0_4_ = menubar; (int)oldi < (int)pp.p[0x13]; oldi._0_4_ = (int)oldi + 1) {
            pmVar9 = pp.p[(long)(int)oldi + -1];
            iVar3 = Fl_Window::shown((Fl_Window *)pmVar9);
            if (iVar3 == 0) {
              if (pp.p[(long)(int)oldi + -1]->title != (menutitle *)0x0) {
                (**(code **)((long)(pp.p[(long)(int)oldi + -1]->title->super_Fl_Menu_Window).
                                   super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                                   super_Fl_Widget._vptr_Fl_Widget + 0x28))();
              }
              pmVar9 = pp.p[(long)(int)oldi + -1];
              (*(pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group
                .super_Fl_Widget._vptr_Fl_Widget[5])();
            }
          }
          cw = _k;
          Fl::wait(pmVar9);
          this_local = (Fl_Menu_Item *)_k;
          if (pp.nummenus == 2) {
            if (pp._184_8_ != 0) {
              (**(code **)(*(long *)pp._184_8_ + 8))();
            }
            while (1 < (int)pp.p[0x13]) {
              pp.p[0x13]._0_4_ = (int)pp.p[0x13] + -1;
              if (pp.p[(long)(int)pp.p[0x13] + -1] != (menuwindow *)0x0) {
                (**(code **)((long)(pp.p[(long)(int)pp.p[0x13] + -1]->super_Fl_Menu_Window).
                                   super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
                                   super_Fl_Widget._vptr_Fl_Widget + 8))();
              }
            }
            Fl_Menu_Window::hide((Fl_Menu_Window *)local_158);
            Fl::grab((Fl_Window *)0x0);
            goto LAB_002005c9;
          }
        } while (_k == cw);
        if (pp._184_8_ != 0) {
          if (pp._184_8_ != 0) {
            (**(code **)(*(long *)pp._184_8_ + 8))();
          }
          pp.state = 0;
          pp._188_4_ = 0;
        }
        if (_k != (menuwindow *)0x0) break;
        pmVar9 = pp.p[(long)((int)pp.p[0x13] + -1) + -1];
        menuwindow::set_selected(pmVar9,-1);
      }
      if (pp._184_8_ != 0) {
        if (pp._184_8_ != 0) {
          (**(code **)(*(long *)pp._184_8_ + 8))();
        }
        pp.state = 0;
        pp._188_4_ = 0;
      }
      w = (Fl_Window *)0x0;
      menuwindow::autoscroll(pp.p[(long)(int)pp.current_item + -1],pp.current_item._4_4_);
    }
    menuwindow::set_selected((menuwindow *)m_1,pp.current_item._4_4_);
    if ((Fl_Window *)title == w) {
      w = (Fl_Window *)0x0;
    }
    pmVar9 = (menuwindow *)title;
    iVar3 = submenu(title);
    if (iVar3 == 0) {
      while ((int)pp.current_item + 1 < (int)pp.p[0x13]) {
        pp.p[0x13]._0_4_ = (int)pp.p[0x13] + -1;
        pmVar8 = pp.p[(long)(int)pp.p[0x13] + -1];
        if (pmVar8 != (menuwindow *)0x0) {
          (*(pmVar8->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget._vptr_Fl_Widget[1])();
          pmVar9 = pmVar8;
        }
      }
      if (((int)pp.current_item == 0) && (pp.p[0x13]._4_4_ != 0)) {
        pmVar8 = (menuwindow *)operator_new(0x118);
        iVar3 = Fl_Widget::x((Fl_Widget *)m_1);
        iVar4 = menuwindow::titlex((menuwindow *)m_1,pp.current_item._4_4_);
        iVar5 = Fl_Widget::y((Fl_Widget *)m_1);
        iVar6 = Fl_Widget::h((Fl_Widget *)m_1);
        menuwindow::menuwindow
                  (pmVar8,(Fl_Menu_Item *)0x0,iVar3 + iVar4,iVar5 + iVar6,0,0,(Fl_Menu_Item *)0x0,
                   title,0,1,0);
        pmVar9 = (menuwindow *)pmVar8->title;
        pp._184_8_ = pmVar8;
        (*(pmVar9->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget._vptr_Fl_Widget[5])();
      }
      goto LAB_001ffa81;
    }
    menutable = title;
    if ((title->flags & 0x40U) == 0) {
      _nY = (Fl_Menu_Item *)title->user_data_;
    }
    else {
      _nY = title + 1;
    }
    if (((int)pp.current_item == 0) && (pp.p[0x13]._4_4_ != 0)) {
      iVar3 = Fl_Widget::x((Fl_Widget *)m_1);
      iVar4 = menuwindow::titlex((menuwindow *)m_1,pp.current_item._4_4_);
      n._4_4_ = iVar3 + iVar4;
      iVar3 = Fl_Widget::y((Fl_Widget *)m_1);
      iVar4 = Fl_Widget::h((Fl_Widget *)m_1);
      n._0_4_ = iVar3 + iVar4;
      w = (Fl_Window *)0x0;
    }
    else {
      iVar3 = Fl_Widget::x((Fl_Widget *)m_1);
      iVar4 = Fl_Widget::w((Fl_Widget *)m_1);
      n._4_4_ = iVar3 + iVar4;
      iVar3 = Fl_Widget::y((Fl_Widget *)m_1);
      n._0_4_ = iVar3 + pp.current_item._4_4_ * *(int *)&m_1[4].user_data_;
      menutable = (Fl_Menu_Item *)0x0;
    }
    if (w == (Fl_Window *)0x0) {
      if (((int)pp.current_item + 1 < (int)pp.p[0x13]) &&
         (pp.p[(long)((int)pp.current_item + 1) + -1]->menu == _nY)) {
        while ((int)pp.current_item + 2 < (int)pp.p[0x13]) {
          pp.p[0x13]._0_4_ = (int)pp.p[0x13] + -1;
          if (pp.p[(long)(int)pp.p[0x13] + -1] != (menuwindow *)0x0) {
            (**(code **)((long)(pp.p[(long)(int)pp.p[0x13] + -1]->super_Fl_Menu_Window).
                               super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
                               ._vptr_Fl_Widget + 8))();
          }
        }
        pmVar9 = pp.p[(long)((int)pp.p[0x13] + -1) + -1];
        menuwindow::set_selected(pmVar9,-1);
      }
      else {
        while ((int)pp.current_item + 1 < (int)pp.p[0x13]) {
          pp.p[0x13]._0_4_ = (int)pp.p[0x13] + -1;
          if (pp.p[(long)(int)pp.p[0x13] + -1] != (menuwindow *)0x0) {
            (**(code **)((long)(pp.p[(long)(int)pp.p[0x13] + -1]->super_Fl_Menu_Window).
                               super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
                               ._vptr_Fl_Widget + 8))();
          }
        }
        pmVar8 = (menuwindow *)operator_new(0x118);
        pFVar2 = menutable;
        pFVar1 = _nY;
        iVar4 = n._4_4_;
        iVar3 = (int)n;
        bVar10 = menutable != (Fl_Menu_Item *)0x0;
        if (menutable == (Fl_Menu_Item *)0x0) {
          local_394 = Fl_Widget::x((Fl_Widget *)m_1);
        }
        else {
          local_394 = 0;
        }
        pmVar9 = pmVar8;
        menuwindow::menuwindow
                  (pmVar8,pFVar1,iVar4,iVar3,(uint)bVar10,0,(Fl_Menu_Item *)0x0,pFVar2,0,menubar,
                   local_394);
        iVar3 = (int)pp.p[0x13];
        pp.p[0x13]._0_4_ = (int)pp.p[0x13] + 1;
        pp.p[(long)iVar3 + -1] = pmVar8;
      }
      goto LAB_001ffa81;
    }
    pmVar8 = (menuwindow *)operator_new(0x118);
    pFVar2 = menutable;
    pFVar1 = _nY;
    iVar3 = Fl_Widget::x((Fl_Widget *)m_1);
    pmVar9 = pmVar8;
    menuwindow::menuwindow(pmVar8,pFVar1,W_local,H_local,W,H,(Fl_Menu_Item *)w,pFVar2,0,0,iVar3);
    iVar3 = (int)pp.p[0x13];
    pp.p[0x13]._0_4_ = (int)pp.p[0x13] + 1;
    pp.p[(long)iVar3 + -1] = pmVar8;
    _dx = pmVar8;
    if (pmVar8->selected < 0) goto LAB_001ffa81;
    iVar3 = Fl_Widget::y((Fl_Widget *)pmVar8);
    waX = iVar3 - (int)n;
    iVar3 = Fl_Widget::x((Fl_Widget *)_dx);
    waY = iVar3 - n._4_4_;
    Fl::screen_work_area(&waW,&waH,&menu,&local_288,W_local,H_local);
    for (tt._4_4_ = 0; tt._4_4_ <= (int)pp.current_item; tt._4_4_ = tt._4_4_ + 1) {
      pmVar9 = pp.p[(long)tt._4_4_ + -1];
      iVar3 = Fl_Widget::x((Fl_Widget *)pmVar9);
      m._4_4_ = iVar3 + waY;
      if (m._4_4_ < waW) {
        m._4_4_ = waW;
        iVar3 = Fl_Widget::x((Fl_Widget *)pmVar9);
        waY = waW - iVar3;
      }
      iVar3 = Fl_Widget::y((Fl_Widget *)pmVar9);
      m._0_4_ = iVar3 + waX;
      if ((int)m < waH) {
        m._0_4_ = waH;
        iVar3 = Fl_Widget::y((Fl_Widget *)pmVar9);
        waX = waH - iVar3;
      }
      menuwindow::position(pmVar9,m._4_4_,(int)m);
    }
    setitem((int)pp.p[0x13] + -1,_dx->selected);
  } while( true );
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::pulldown(
    int X, int Y, int W, int H,
    const Fl_Menu_Item* initial_item,
    const Fl_Menu_* pbutton,
    const Fl_Menu_Item* t,
    int menubar) const {
  Fl_Group::current(0); // fix possible user error...

  button = pbutton;
  if (pbutton && pbutton->window()) {
    for (Fl_Window* w = pbutton->window(); w; w = w->window()) {
      X += w->x();
      Y += w->y();
    }
  } else {
    X += Fl::event_x_root()-Fl::event_x();
    Y += Fl::event_y_root()-Fl::event_y();
  }
  menuwindow mw(this, X, Y, W, H, initial_item, t, menubar);
  Fl::grab(mw);
  menustate pp; p = &pp;
  pp.p[0] = &mw;
  pp.nummenus = 1;
  pp.menubar = menubar;
  pp.state = INITIAL_STATE;
  pp.fakemenu = 0; // kludge for buttons in menubar

  // preselected item, pop up submenus if necessary:
  if (initial_item && mw.selected >= 0) {
    setitem(0, mw.selected);
    goto STARTUP;
  }

  pp.current_item = 0; pp.menu_number = 0; pp.item_number = -1;
  if (menubar) {
    // find the initial menu
    if (!mw.handle(FL_DRAG)) {
      Fl::grab(0);
      return 0;
    }
  }
  initial_item = pp.current_item;
  if (initial_item) goto STARTUP;

  // the main loop, runs until p.state goes to DONE_STATE:
  for (;;) {

    // make sure all the menus are shown:
    {
      for (int k = menubar; k < pp.nummenus; k++) {
        if (!pp.p[k]->shown()) {
	  if (pp.p[k]->title) pp.p[k]->title->show();
	  pp.p[k]->show();
        }
      }
    }

    // get events:
    {
      const Fl_Menu_Item* oldi = pp.current_item;
      Fl::wait();
      if (pp.state == DONE_STATE) break; // done.
      if (pp.current_item == oldi) continue;
    }

    // only do rest if item changes:
    if(pp.fakemenu) {delete pp.fakemenu; pp.fakemenu = 0;} // turn off "menubar button"

    if (!pp.current_item) { // pointing at nothing
      // turn off selection in deepest menu, but don't erase other menus:
      pp.p[pp.nummenus-1]->set_selected(-1);
      continue;
    }

    if(pp.fakemenu) {delete pp.fakemenu; pp.fakemenu = 0;}
    initial_item = 0; // stop the startup code
    pp.p[pp.menu_number]->autoscroll(pp.item_number);

  STARTUP:
    menuwindow& cw = *pp.p[pp.menu_number];
    const Fl_Menu_Item* m = pp.current_item;
    if (!m->activevisible()) { // pointing at inactive item
      cw.set_selected(-1);
      initial_item = 0; // turn off startup code
      continue;
    }
    cw.set_selected(pp.item_number);

    if (m==initial_item) initial_item=0; // stop the startup code if item found
    if (m->submenu()) {
      const Fl_Menu_Item* title = m;
      const Fl_Menu_Item* menutable;
      if (m->flags&FL_SUBMENU) menutable = m+1;
      else menutable = (Fl_Menu_Item*)(m)->user_data_;
      // figure out where new menu goes:
      int nX, nY;
      if (!pp.menu_number && pp.menubar) {	// menu off a menubar:
	nX = cw.x() + cw.titlex(pp.item_number);
	nY = cw.y() + cw.h();
	initial_item = 0;
      } else {
	nX = cw.x() + cw.w();
	nY = cw.y() + pp.item_number * cw.itemheight;
	title = 0;
      }
      if (initial_item) { // bring up submenu containing initial item:
	menuwindow* n = new menuwindow(menutable,X,Y,W,H,initial_item,title,0,0,cw.x());
	pp.p[pp.nummenus++] = n;
	// move all earlier menus to line up with this new one:
	if (n->selected>=0) {
	  int dy = n->y()-nY;
	  int dx = n->x()-nX;
	  int waX, waY, waW, waH;
	  Fl::screen_work_area(waX, waY, waW, waH, X, Y);
	  for (int menu = 0; menu <= pp.menu_number; menu++) {
	    menuwindow* tt = pp.p[menu];
	    int nx = tt->x()+dx; if (nx < waX) {nx = waX; dx = -tt->x() + waX;}
	    int ny = tt->y()+dy; if (ny < waY) {ny = waY; dy = -tt->y() + waY;}
	    tt->position(nx, ny);
	  }
	  setitem(pp.nummenus-1, n->selected);
	  goto STARTUP;
	}
      } else if (pp.nummenus > pp.menu_number+1 &&
		 pp.p[pp.menu_number+1]->menu == menutable) {
	// the menu is already up:
	while (pp.nummenus > pp.menu_number+2) delete pp.p[--pp.nummenus];
	pp.p[pp.nummenus-1]->set_selected(-1);
      } else {
	// delete all the old menus and create new one:
	while (pp.nummenus > pp.menu_number+1) delete pp.p[--pp.nummenus];
	pp.p[pp.nummenus++]= new menuwindow(menutable, nX, nY,
					  title?1:0, 0, 0, title, 0, menubar, 
					    (title ? 0 : cw.x()) );
      }
    } else { // !m->submenu():
      while (pp.nummenus > pp.menu_number+1) delete pp.p[--pp.nummenus];
      if (!pp.menu_number && pp.menubar) {
	// kludge so "menubar buttons" turn "on" by using menu title:
	pp.fakemenu = new menuwindow(0,
				  cw.x()+cw.titlex(pp.item_number),
				  cw.y()+cw.h(), 0, 0,
				  0, m, 0, 1);
	pp.fakemenu->title->show();
      }
    }
  }
  const Fl_Menu_Item* m = pp.current_item;
  delete pp.fakemenu;
  while (pp.nummenus>1) delete pp.p[--pp.nummenus];
  mw.hide();
  Fl::grab(0);
  return m;
}